

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff80;
  pointer *__value;
  allocator_type *in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  value_type_conflict *in_stack_ffffffffffffff90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  size_type in_stack_ffffffffffffff98;
  
  std::shared_ptr<fasttext::Args>::shared_ptr
            (in_stack_ffffffffffffff80,(shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff78);
  std::allocator<int>::allocator((allocator<int> *)0x161ef3);
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::allocator<int>::~allocator((allocator<int> *)0x161f18);
  __value = &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::vector
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x161f2b);
  __last._M_current =
       (int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x161f3e);
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xffffffffffffffff;
  __first._M_current =
       (int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x161f7e);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,__last,(int *)__value);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args)
		: args_(args),
			word2int_(MAX_VOCAB_SIZE, -1),
			size_(0),
			nwords_(0),
			nlabels_(0),
			ntokens_(0),
			nids_(0),
			pruneidx_size_(-1) {
				std::fill(word2int_.begin(), word2int_.end(), -1);
			}